

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

half anon_unknown.dwarf_16f66::filterY<Imath_3_2::half>
               (TypedImageChannel<Imath_3_2::half> *channel,int h,int x,double y,Extrapolation ext)

{
  half *this;
  double unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  TypedImageChannel<Imath_3_2::half> *in_stack_00000010;
  float in_stack_ffffffffffffffbc;
  Extrapolation in_stack_fffffffffffffffc;
  uint16_t uVar1;
  
  this = (half *)sampleY<Imath_3_2::half>
                           (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
                            in_stack_fffffffffffffffc);
  sampleY<Imath_3_2::half>
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
             in_stack_fffffffffffffffc);
  sampleY<Imath_3_2::half>
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
             in_stack_fffffffffffffffc);
  sampleY<Imath_3_2::half>
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
             in_stack_fffffffffffffffc);
  uVar1 = (uint16_t)(in_stack_fffffffffffffffc >> 0x10);
  Imath_3_2::half::half(this,in_stack_ffffffffffffffbc);
  return (half)uVar1;
}

Assistant:

T
filterY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Vertical four-tap filter, centered on pixel (x, y + 0.5)
    //

    return T (
        0.125 * sampleY (channel, h, x, y - 1, ext) +
        0.375 * sampleY (channel, h, x, y, ext) +
        0.375 * sampleY (channel, h, x, y + 1, ext) +
        0.125 * sampleY (channel, h, x, y + 2, ext));
}